

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bstricmp(bstring b0,bstring b1)

{
  int iVar1;
  uchar local_50;
  uchar local_4c;
  uchar local_48;
  uchar local_44;
  uchar *local_40;
  uchar *local_38;
  int local_2c;
  int n;
  int v;
  int i;
  bstring b1_local;
  bstring b0_local;
  
  if ((b0 == (bstring)0x0) || (b0->data == (uchar *)0x0)) {
    local_38 = (uchar *)0x0;
  }
  else {
    local_38 = b0->data;
  }
  if ((local_38 != (uchar *)0x0) && (-1 < b0->slen)) {
    if ((b1 == (bstring)0x0) || (b1->data == (uchar *)0x0)) {
      local_40 = (uchar *)0x0;
    }
    else {
      local_40 = b1->data;
    }
    if ((local_40 != (uchar *)0x0) && (-1 < b1->slen)) {
      local_2c = b0->slen;
      if (b1->slen < local_2c) {
        local_2c = b1->slen;
      }
      else if ((b0->slen == b1->slen) && (b0->data == b1->data)) {
        return 0;
      }
      for (n = 0; n < local_2c; n = n + 1) {
        if (b0->data[n] < 0x80) {
          iVar1 = tolower((uint)b0->data[n]);
          local_44 = (uchar)iVar1;
        }
        else {
          local_44 = b0->data[n];
        }
        if (b1->data[n] < 0x80) {
          iVar1 = tolower((uint)b1->data[n]);
          local_48 = (uchar)iVar1;
        }
        else {
          local_48 = b1->data[n];
        }
        if (local_44 != local_48) {
          return (uint)b0->data[n] - (uint)b1->data[n];
        }
      }
      if (local_2c < b0->slen) {
        if (b0->data[local_2c] < 0x80) {
          iVar1 = tolower((uint)b0->data[local_2c]);
          local_4c = (uchar)iVar1;
        }
        else {
          local_4c = b0->data[local_2c];
        }
        if ((char)local_4c != 0) {
          return (int)(char)local_4c;
        }
        return 0x100;
      }
      if (b1->slen <= local_2c) {
        return 0;
      }
      if (b1->data[local_2c] < 0x80) {
        iVar1 = tolower((uint)b1->data[local_2c]);
        local_50 = (uchar)iVar1;
      }
      else {
        local_50 = b1->data[local_2c];
      }
      if (-(int)(char)local_50 != 0) {
        return -(int)(char)local_50;
      }
      return -0x100;
    }
  }
  return -0x8000;
}

Assistant:

int bstricmp (const bstring b0, const bstring b1) {
int i, v, n;

	if (bdata (b0) == NULL || b0->slen < 0 || 
	    bdata (b1) == NULL || b1->slen < 0) return SHRT_MIN;
	if ((n = b0->slen) > b1->slen) n = b1->slen;
	else if (b0->slen == b1->slen && b0->data == b1->data) return 0;

	for (i = 0; i < n; i ++) {
		v  = (char) downcase (b0->data[i]);
		v -= (char) downcase (b1->data[i]);
		if (v != 0) return b0->data[i] - b1->data[i];
	}

	if (b0->slen > n) {
		v = (char) downcase (b0->data[n]);
		if (v) return v;
		return UCHAR_MAX + 1;
	}
	if (b1->slen > n) {
		v = - (char) downcase (b1->data[n]);
		if (v) return v;
		return - (int) (UCHAR_MAX + 1);
	}
	return 0;
}